

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propertyId,ScriptContext *scriptContext,
               PropertyDescriptor *propertyDescriptor)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  Var local_48;
  Var value;
  Var getter;
  Var setter;
  
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x544,"(obj)","obj");
    if (!bVar2) goto LAB_00997ac2;
    *puVar5 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x545,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00997ac2;
    *puVar5 = 0;
  }
  if (propertyDescriptor == (PropertyDescriptor *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x546,"(propertyDescriptor)","propertyDescriptor");
    if (!bVar2) {
LAB_00997ac2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = VarIsImpl<Js::JavascriptProxy>(obj);
  if (bVar2) {
    BVar3 = JavascriptProxy::GetOwnPropertyDescriptor
                      (obj,propertyId,scriptContext,propertyDescriptor);
    return BVar3;
  }
  BVar3 = GetOwnAccessors(obj,propertyId,&value,&getter,scriptContext);
  if (BVar3 == 0) {
    local_48 = (Var)0x0;
    BVar3 = GetOwnProperty(obj,propertyId,&local_48,scriptContext,(PropertyValueInfo *)0x0);
    if (BVar3 == 0) {
      return 0;
    }
    if (local_48 != (Var)0x0) {
      PropertyDescriptor::SetValue(propertyDescriptor,local_48);
    }
    iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x30])(obj,(ulong)(uint)propertyId);
    PropertyDescriptor::SetWritable(propertyDescriptor,iVar4 != 0);
  }
  else {
    if (value == (Var)0x0) {
      value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    PropertyDescriptor::SetGetter(propertyDescriptor,value);
    if (getter == (Var)0x0) {
      getter = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    PropertyDescriptor::SetSetter(propertyDescriptor,getter);
  }
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x31])(obj,(ulong)(uint)propertyId);
  PropertyDescriptor::SetConfigurable(propertyDescriptor,iVar4 != 0);
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x32])(obj,(ulong)(uint)propertyId);
  PropertyDescriptor::SetEnumerable(propertyDescriptor,iVar4 != 0);
  return 1;
}

Assistant:

BOOL JavascriptOperators::GetOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propertyId, ScriptContext* scriptContext, PropertyDescriptor* propertyDescriptor)
    {
        Assert(obj);
        Assert(scriptContext);
        Assert(propertyDescriptor);

        if (VarIs<JavascriptProxy>(obj))
        {
            return JavascriptProxy::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, propertyDescriptor);
        }
        Var getter, setter;
        if (false == JavascriptOperators::GetOwnAccessors(obj, propertyId, &getter, &setter, scriptContext))
        {
            Var value = nullptr;
            if (false == JavascriptOperators::GetOwnProperty(obj, propertyId, &value, scriptContext, nullptr))
            {
                return FALSE;
            }
            if (nullptr != value)
            {
                propertyDescriptor->SetValue(value);
            }

            //CONSIDER : Its expensive to query for each flag from type system. Combine this with the GetOwnProperty to get all the flags
            //at once. This will require a new API from type system and override in all the types which overrides IsEnumerable etc.
            //Currently there is no performance tuning for ES5. This should be ok.
            propertyDescriptor->SetWritable(FALSE != obj->IsWritable(propertyId));
        }
        else
        {
            if (nullptr == getter)
            {
                getter = scriptContext->GetLibrary()->GetUndefined();
            }
            propertyDescriptor->SetGetter(getter);

            if (nullptr == setter)
            {
                setter = scriptContext->GetLibrary()->GetUndefined();
            }
            propertyDescriptor->SetSetter(setter);
        }

        propertyDescriptor->SetConfigurable(FALSE != obj->IsConfigurable(propertyId));
        propertyDescriptor->SetEnumerable(FALSE != obj->IsEnumerable(propertyId));
        return TRUE;
    }